

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe_file_system.cpp
# Opt level: O3

void __thiscall duckdb::PipeFileSystem::Reset(PipeFileSystem *this,FileHandle *handle)

{
  InternalException *this_00;
  string local_40;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot reset pipe file system","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void PipeFileSystem::Reset(FileHandle &handle) {
	throw InternalException("Cannot reset pipe file system");
}